

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

bool __thiscall
ON_String::Equal(ON_String *this,char *other_string,ON_Locale *locale,bool bIgnoreCase)

{
  bool bVar1;
  int element_count1;
  char *string1;
  bool bIgnoreCase_local;
  ON_Locale *locale_local;
  char *other_string_local;
  ON_String *this_local;
  
  string1 = operator_cast_to_char_(this);
  element_count1 = Length(this);
  bVar1 = Equal(string1,element_count1,other_string,-1,locale,bIgnoreCase);
  return bVar1;
}

Assistant:

bool ON_String::Equal(
  const char* other_string,
  const class ON_Locale& locale,
  bool bIgnoreCase
  ) const
{
  return ON_String::Equal(
    static_cast<const char*>(*this),
    this->Length(),
    other_string,
    -1,
    locale,
    bIgnoreCase );
}